

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cc
# Opt level: O0

void __thiscall Database::initSlices(Database *this)

{
  int iVar1;
  char *pcVar2;
  void *pvVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> filename;
  int i;
  bool need_init;
  stat st;
  undefined4 in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe94;
  Database *this_00;
  char *in_stack_fffffffffffffeb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  string local_130 [12];
  int in_stack_fffffffffffffedc;
  string local_110 [32];
  string local_f0 [32];
  undefined4 in_stack_ffffffffffffff30;
  uint uVar4;
  uint in_stack_ffffffffffffff34;
  stat local_c8;
  
  this_00 = (Database *)&stack0xffffffffffffffd8;
  std::operator+(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = open(pcVar2,0x42,0x1a4);
  *(int *)(in_RDI + 0xc070) = iVar1;
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd8);
  if (*(int *)(in_RDI + 0xc070) < 1) {
    __assert_fail("metadata_fd > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/Harry-Chen[P]TrivialKV/engine_race/database.cc"
                  ,0x4a,"void Database::initSlices()");
  }
  memset(&local_c8,0,0x90);
  fstat(*(int *)(in_RDI + 0xc070),&local_c8);
  in_stack_ffffffffffffff34 = in_stack_ffffffffffffff34 & 0xffffff;
  if (local_c8.st_size == 0) {
    ftruncate(*(int *)(in_RDI + 0xc070),0xc);
    in_stack_ffffffffffffff34 = CONCAT13(1,(int3)in_stack_ffffffffffffff34);
  }
  pvVar3 = mmap((void *)0x0,0x1000,3,1,*(int *)(in_RDI + 0xc070),0);
  *(void **)(in_RDI + 0xc078) = pvVar3;
  if (*(long *)(in_RDI + 0xc078) != -1) {
    if ((in_stack_ffffffffffffff34 & 0x1000000) == 0) {
      for (uVar4 = 0; uVar4 < **(uint **)(in_RDI + 0xc078); uVar4 = uVar4 + 1) {
        std::operator+(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
        std::__cxx11::to_string(in_stack_fffffffffffffedc);
        std::operator+(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
        std::operator+(in_RDI,(char *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90))
        ;
        std::__cxx11::string::~string(local_110);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffeb0);
        std::__cxx11::string::~string(local_130);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        in_stack_fffffffffffffe94 = open(pcVar2,2,0x1a4);
        *(int *)(in_RDI + (long)(int)uVar4 * 4 + 0x68) = in_stack_fffffffffffffe94;
        if (*(int *)(in_RDI + (long)(int)uVar4 * 4 + 0x68) < 1) {
          __assert_fail("slice_fd[i] > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/Harry-Chen[P]TrivialKV/engine_race/database.cc"
                        ,0x61,"void Database::initSlices()");
        }
        mapSlice(this_00,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
        std::__cxx11::string::~string(local_f0);
      }
      *(undefined8 *)(in_RDI + 0xc068) =
           *(undefined8 *)(in_RDI + (ulong)(**(int **)(in_RDI + 0xc078) - 1) * 8 + 0x4068);
    }
    else {
      **(undefined4 **)(in_RDI + 0xc078) = 0;
      iVar1 = createNewSlice((Database *)
                             CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      *(int *)(in_RDI + 0x68) = iVar1;
      mapSlice(this_00,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
      *(undefined8 *)(in_RDI + 0xc068) = *(undefined8 *)(in_RDI + 0x4068);
    }
    return;
  }
  __assert_fail("metadata != MAP_FAILED",
                "/workspace/llm4binary/github/license_c_cmakelists/Harry-Chen[P]TrivialKV/engine_race/database.cc"
                ,0x56,"void Database::initSlices()");
}

Assistant:

void Database::initSlices() {
    metadata_fd = open((file_prefix + ".metadata").c_str(), O_RDWR|O_CREAT, 0644);
    assert(metadata_fd > 0);
    struct stat st = {};
    fstat(metadata_fd, &st);

    bool need_init = false;

    if (st.st_size == 0) {
        ftruncate(metadata_fd, sizeof(DatabaseMetadata));
        need_init = true;
    }

    metadata = reinterpret_cast<DatabaseMetadata*>(mmap(nullptr, 4096, PROT_READ | PROT_WRITE, MAP_SHARED, metadata_fd, 0));
    assert(metadata != MAP_FAILED);

    if (need_init) {
        metadata->sliceCount = 0;
        slice_fd[0] = createNewSlice();
        mapSlice(slice_fd[0], 0);
        currentSlice = slices[0];
    } else {
        for (int i = 0; i < metadata->sliceCount; ++i) {
            auto filename = file_prefix + "." + std::to_string(i) + ".data";
            slice_fd[i] = open(filename.c_str(), O_RDWR, 0644);
            assert(slice_fd[i] > 0);
            mapSlice(slice_fd[i], i);
        }
//        printf("%d %d %d\n", *sliceCount, *currentSliceNumber, *currentOffset);
        currentSlice = slices[metadata->sliceCount - 1];
    }


}